

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O1

void __thiscall
glslang::TParseContext::handleIndexLimits
          (TParseContext *this,TSourceLoc *param_1,TIntermTyped *base,TIntermTyped *index)

{
  pointer *pppTVar1;
  iterator __position;
  char cVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar4;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  uint uVar5;
  TIntermTyped *local_18;
  
  local_18 = index;
  if (((this->limits->generalSamplerIndexing == false) &&
      (iVar3 = (*(base->super_TIntermNode)._vptr_TIntermNode[0x20])(base), iVar3 == 0xe)) ||
     ((this->limits->generalUniformIndexing == false &&
      ((iVar3 = (*(base->super_TIntermNode)._vptr_TIntermNode[0x21])(base),
       0xfffffffd < (*(uint *)(CONCAT44(extraout_var_04,iVar3) + 8) & 0x7f) - 7 &&
       ((this->super_TParseContextBase).super_TParseVersions.language != EShLangVertex))))))
  goto LAB_0041d8f2;
  if (this->limits->generalAttributeMatrixVectorIndexing == false) {
    iVar3 = (*(base->super_TIntermNode)._vptr_TIntermNode[0x21])(base);
    uVar5 = *(uint *)(CONCAT44(extraout_var_05,iVar3) + 8) & 0x7f;
    if (((uVar5 < 0x1c) && ((0xe300008U >> ((byte)uVar5 & 0x1f) & 1) != 0)) &&
       ((this->super_TParseContextBase).super_TParseVersions.language == EShLangVertex)) {
      iVar3 = (*(base->super_TIntermNode)._vptr_TIntermNode[0x1e])(base);
      cVar2 = (**(code **)(*(long *)CONCAT44(extraout_var_06,iVar3) + 0xe0))
                        ((long *)CONCAT44(extraout_var_06,iVar3));
      if (cVar2 != '\0') goto LAB_0041d8f2;
      iVar3 = (*(base->super_TIntermNode)._vptr_TIntermNode[0x1e])(base);
      cVar2 = (**(code **)(*(long *)CONCAT44(extraout_var_07,iVar3) + 0xd8))
                        ((long *)CONCAT44(extraout_var_07,iVar3));
      if (cVar2 != '\0') goto LAB_0041d8f2;
    }
  }
  if ((this->limits->generalConstantMatrixVectorIndexing != false) ||
     (iVar3 = (*(base->super_TIntermNode)._vptr_TIntermNode[5])(base),
     CONCAT44(extraout_var,iVar3) == 0)) {
    if (this->limits->generalVariableIndexing == false) {
      iVar3 = (*(base->super_TIntermNode)._vptr_TIntermNode[0x1e])(base);
      lVar4 = (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar3) + 0x58))
                        ((long *)CONCAT44(extraout_var_00,iVar3));
      if (1 < (*(uint *)(lVar4 + 8) & 0x7f) - 5) {
        iVar3 = (*(base->super_TIntermNode)._vptr_TIntermNode[0x1e])(base);
        lVar4 = (**(code **)(*(long *)CONCAT44(extraout_var_01,iVar3) + 0x58))
                          ((long *)CONCAT44(extraout_var_01,iVar3));
        if ((0x1b < (*(uint *)(lVar4 + 8) & 0x7f)) ||
           ((0xe300008U >> (*(uint *)(lVar4 + 8) & 0x1f) & 1) == 0)) {
          iVar3 = (*(base->super_TIntermNode)._vptr_TIntermNode[0x1e])(base);
          lVar4 = (**(code **)(*(long *)CONCAT44(extraout_var_08,iVar3) + 0x58))
                            ((long *)CONCAT44(extraout_var_08,iVar3));
          if ((0x1e < (*(uint *)(lVar4 + 8) & 0x7f)) ||
             ((0x71c00010U >> (*(uint *)(lVar4 + 8) & 0x1f) & 1) == 0)) {
            iVar3 = (*(base->super_TIntermNode)._vptr_TIntermNode[0x1e])(base);
            lVar4 = (**(code **)(*(long *)CONCAT44(extraout_var_09,iVar3) + 0x58))
                              ((long *)CONCAT44(extraout_var_09,iVar3));
            if ((*(ulong *)(lVar4 + 8) & 0x10000007f) != 2 &&
                (*(ulong *)(lVar4 + 8) >> 0x20 & 1) == 0) goto LAB_0041d8f2;
          }
        }
      }
    }
    if (this->limits->generalVaryingIndexing != false) {
      return;
    }
    iVar3 = (*(base->super_TIntermNode)._vptr_TIntermNode[0x1e])(base);
    lVar4 = (**(code **)(*(long *)CONCAT44(extraout_var_02,iVar3) + 0x58))
                      ((long *)CONCAT44(extraout_var_02,iVar3));
    if ((0x1b < (*(uint *)(lVar4 + 8) & 0x7f)) ||
       ((0xe300008U >> (*(uint *)(lVar4 + 8) & 0x1f) & 1) == 0)) {
      iVar3 = (*(base->super_TIntermNode)._vptr_TIntermNode[0x1e])(base);
      lVar4 = (**(code **)(*(long *)CONCAT44(extraout_var_03,iVar3) + 0x58))
                        ((long *)CONCAT44(extraout_var_03,iVar3));
      if (0x1e < (*(uint *)(lVar4 + 8) & 0x7f)) {
        return;
      }
      if ((0x71c00010U >> (*(uint *)(lVar4 + 8) & 0x1f) & 1) == 0) {
        return;
      }
    }
  }
LAB_0041d8f2:
  __position._M_current =
       (this->needsIndexLimitationChecking).
       super_vector<glslang::TIntermTyped_*,_glslang::pool_allocator<glslang::TIntermTyped_*>_>.
       super__Vector_base<glslang::TIntermTyped_*,_glslang::pool_allocator<glslang::TIntermTyped_*>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->needsIndexLimitationChecking).
      super_vector<glslang::TIntermTyped_*,_glslang::pool_allocator<glslang::TIntermTyped_*>_>.
      super__Vector_base<glslang::TIntermTyped_*,_glslang::pool_allocator<glslang::TIntermTyped_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<glslang::TIntermTyped*,glslang::pool_allocator<glslang::TIntermTyped*>>::
    _M_realloc_insert<glslang::TIntermTyped*const&>
              ((vector<glslang::TIntermTyped*,glslang::pool_allocator<glslang::TIntermTyped*>> *)
               &this->needsIndexLimitationChecking,__position,&local_18);
  }
  else {
    *__position._M_current = local_18;
    pppTVar1 = &(this->needsIndexLimitationChecking).
                super_vector<glslang::TIntermTyped_*,_glslang::pool_allocator<glslang::TIntermTyped_*>_>
                .
                super__Vector_base<glslang::TIntermTyped_*,_glslang::pool_allocator<glslang::TIntermTyped_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    *pppTVar1 = *pppTVar1 + 1;
  }
  return;
}

Assistant:

void TParseContext::handleIndexLimits(const TSourceLoc& /*loc*/, TIntermTyped* base, TIntermTyped* index)
{
    if ((! limits.generalSamplerIndexing && base->getBasicType() == EbtSampler) ||
        (! limits.generalUniformIndexing && base->getQualifier().isUniformOrBuffer() && language != EShLangVertex) ||
        (! limits.generalAttributeMatrixVectorIndexing && base->getQualifier().isPipeInput() && language == EShLangVertex && (base->getType().isMatrix() || base->getType().isVector())) ||
        (! limits.generalConstantMatrixVectorIndexing && base->getAsConstantUnion()) ||
        (! limits.generalVariableIndexing && ! base->getType().getQualifier().isUniformOrBuffer() &&
                                             ! base->getType().getQualifier().isPipeInput() &&
                                             ! base->getType().getQualifier().isPipeOutput() &&
                                             ! base->getType().getQualifier().isConstant()) ||
        (! limits.generalVaryingIndexing && (base->getType().getQualifier().isPipeInput() ||
                                                base->getType().getQualifier().isPipeOutput()))) {
        // it's too early to know what the inductive variables are, save it for post processing
        needsIndexLimitationChecking.push_back(index);
    }
}